

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.h
# Opt level: O2

fiobj_object_vtable_s * fiobj_type_vtable(FIOBJ o)

{
  fiobj_type_enum fVar1;
  fiobj_object_vtable_s *pfVar2;
  
  fVar1 = fiobj_type(o);
  switch(fVar1) {
  case FIOBJ_T_FLOAT:
    pfVar2 = &FIOBJECT_VTABLE_FLOAT;
    break;
  case FIOBJ_T_STRING:
    pfVar2 = &FIOBJECT_VTABLE_STRING;
    break;
  case FIOBJ_T_ARRAY:
    pfVar2 = &FIOBJECT_VTABLE_ARRAY;
    break;
  case FIOBJ_T_HASH:
    pfVar2 = &FIOBJECT_VTABLE_HASH;
    break;
  case FIOBJ_T_DATA:
    pfVar2 = &FIOBJECT_VTABLE_DATA;
    break;
  default:
    if (fVar1 == FIOBJ_T_NUMBER) {
      return &FIOBJECT_VTABLE_NUMBER;
    }
  case FIOBJ_T_FALSE:
  case FIOBJ_T_UNKNOWN:
    pfVar2 = (fiobj_object_vtable_s *)0x0;
  }
  return pfVar2;
}

Assistant:

void __attribute__((format(printf, 1, 0), weak))
FIO_LOG2STDERR(const char *format, ...) {
  char tmp___log[FIO_LOG____LENGTH_ON_STACK];
  va_list argv;
  va_start(argv, format);
  int len___log = vsnprintf(tmp___log, FIO_LOG_LENGTH_LIMIT - 2, format, argv);
  va_end(argv);
  if (len___log <= 0 || len___log >= FIO_LOG_LENGTH_LIMIT - 2) {
    if (len___log >= FIO_LOG_LENGTH_LIMIT - 2) {
      memcpy(tmp___log + FIO_LOG____LENGTH_BORDER, "... (warning: truncated).",
             25);
      len___log = FIO_LOG____LENGTH_BORDER + 25;
    } else {
      fwrite("ERROR: log output error (can't write).\n", 39, 1, stderr);
      return;
    }
  }
  tmp___log[len___log++] = '\n';
  tmp___log[len___log] = '0';
  fwrite(tmp___log, len___log, 1, stderr);
}